

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdAddTargetAmountForFundRawTx
              (void *handle,void *fund_handle,uint32_t asset_index,int64_t amount,char *asset,
              char *reserved_address)

{
  long *plVar1;
  bool bVar2;
  CfdException *this;
  allocator local_99;
  CfdCapiFundTargetAmount object;
  allocator local_50 [32];
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&object,"FundRawTxData",local_50);
  cfd::capi::CheckBuffer(fund_handle,&object.asset);
  std::__cxx11::string::~string((string *)&object);
  plVar1 = *(long **)((long)fund_handle + 0x58);
  if (plVar1 != (long *)0x0) {
    if ((ulong)asset_index < (ulong)((plVar1[1] - *plVar1) / 0x48)) {
      object.asset._M_dataplus._M_p = (pointer)&object.asset.field_2;
      object.asset._M_string_length = 0;
      object.asset.field_2._M_allocated_capacity =
           object.asset.field_2._M_allocated_capacity & 0xffffffffffffff00;
      object.reserved_address._M_dataplus._M_p = (pointer)&object.reserved_address.field_2;
      object.reserved_address._M_string_length = 0;
      object.reserved_address.field_2._M_local_buf[0] = '\0';
      object.amount = amount;
      std::__cxx11::string::assign((char *)&object.reserved_address);
      bVar2 = cfd::capi::IsEmptyString(asset);
      if (!bVar2) {
        std::__cxx11::string::string((string *)local_50,asset,&local_99);
        std::__cxx11::string::operator=((string *)&object,(string *)local_50);
        std::__cxx11::string::~string((string *)local_50);
      }
      cfd::capi::CfdCapiFundTargetAmount::operator=
                ((CfdCapiFundTargetAmount *)
                 ((ulong)asset_index * 0x48 + **(long **)((long)fund_handle + 0x58)),&object);
      cfd::capi::CfdCapiFundTargetAmount::~CfdCapiFundTargetAmount(&object);
      return 0;
    }
  }
  object.asset._M_dataplus._M_p = "cfdcapi_transaction.cpp";
  object.asset._M_string_length = CONCAT44(object.asset._M_string_length._4_4_,0xc64);
  object.asset.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_83e4d1;
  cfd::core::logger::warn<>((CfdSourceLocation *)&object,"target amounts is maximum over.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&object,"Failed to parameter. target amounts is maximum over.",local_50);
  cfd::core::CfdException::CfdException(this,kCfdOutOfRangeError,&object.asset);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTargetAmountForFundRawTx(
    void* handle, void* fund_handle, uint32_t asset_index, int64_t amount,
    const char* asset, const char* reserved_address) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    /*
    if (IsEmptyString(reserved_address)) {
      warn(CFD_LOG_SOURCE, "reserved_address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. reserved_address is null.");
    }
    */

    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);
    if ((buffer->targets == nullptr) ||
        (asset_index >= buffer->targets->size())) {
      warn(CFD_LOG_SOURCE, "target amounts is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. target amounts is maximum over.");
    }

    CfdCapiFundTargetAmount object;
    object.amount = amount;
    object.reserved_address = reserved_address;
    if (!IsEmptyString(asset)) {
#ifndef CFD_DISABLE_ELEMENTS
      object.asset = std::string(asset);
#endif  // CFD_DISABLE_ELEMENTS
    }

    (*buffer->targets)[asset_index] = object;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}